

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JoystickImpl.cpp
# Opt level: O0

bool sf::priv::JoystickImpl::isConnected(uint index)

{
  bool bVar1;
  udev_device *udevDevice_00;
  size_type sVar2;
  reference pvVar3;
  udev_device *udevDevice;
  uint index_local;
  
  if ((anonymous_namespace)::udevMonitor == 0) {
    anon_unknown.dwarf_96114::updatePluggedList((udev_device *)0x0);
  }
  else {
    bVar1 = anon_unknown.dwarf_96114::hasMonitorEvent();
    if (bVar1) {
      udevDevice_00 = (udev_device *)udev_monitor_receive_device((anonymous_namespace)::udevMonitor)
      ;
      anon_unknown.dwarf_96114::updatePluggedList(udevDevice_00);
      if (udevDevice_00 != (udev_device *)0x0) {
        udev_device_unref(udevDevice_00);
      }
    }
  }
  sVar2 = std::
          vector<(anonymous_namespace)::JoystickRecord,_std::allocator<(anonymous_namespace)::JoystickRecord>_>
          ::size((vector<(anonymous_namespace)::JoystickRecord,_std::allocator<(anonymous_namespace)::JoystickRecord>_>
                  *)(anonymous_namespace)::joystickList);
  if (index < sVar2) {
    pvVar3 = std::
             vector<(anonymous_namespace)::JoystickRecord,_std::allocator<(anonymous_namespace)::JoystickRecord>_>
             ::operator[]((vector<(anonymous_namespace)::JoystickRecord,_std::allocator<(anonymous_namespace)::JoystickRecord>_>
                           *)(anonymous_namespace)::joystickList,(ulong)index);
    udevDevice._7_1_ = (bool)(pvVar3->plugged & 1);
  }
  else {
    udevDevice._7_1_ = false;
  }
  return udevDevice._7_1_;
}

Assistant:

bool JoystickImpl::isConnected(unsigned int index)
{
    // See if we can skip scanning if udev monitor is available
    if (!udevMonitor)
    {
        // udev monitor is not available, perform a scan every query
        updatePluggedList();
    }
    else if (hasMonitorEvent())
    {
        // Check if new joysticks were added/removed since last update
        udev_device* udevDevice = udev_monitor_receive_device(udevMonitor);

        // If we can get the specific device, we check that,
        // otherwise just do a full scan if udevDevice == NULL
        updatePluggedList(udevDevice);

        if (udevDevice)
            udev_device_unref(udevDevice);
    }

    if (index >= joystickList.size())
        return false;

    // Then check if the joystick is connected
    return joystickList[index].plugged;
}